

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O2

_Bool page_trylock_add(uc_struct_conflict15 *uc,page_collection *set,tb_page_addr_t addr)

{
  tb_page_addr_t tVar1;
  PageDesc *pPVar2;
  page_entry *value;
  tb_page_addr_t index;
  
  index = addr >> 0xe;
  pPVar2 = (PageDesc *)g_tree_lookup(set->tree,&index);
  if (pPVar2 == (PageDesc *)0x0) {
    pPVar2 = page_find(uc,index);
    tVar1 = index;
    if (pPVar2 != (PageDesc *)0x0) {
      value = (page_entry *)g_malloc(0x18);
      value->index = tVar1;
      value->pd = pPVar2;
      g_tree_insert(set->tree,&value->index,value);
      pPVar2 = (PageDesc *)set->max;
      if ((pPVar2 == (PageDesc *)0x0) || (pPVar2->code_bitmap < (unsigned_long *)value->index)) {
        set->max = value;
      }
    }
  }
  return SUB81(pPVar2,0);
}

Assistant:

static bool page_trylock_add(struct uc_struct *uc, struct page_collection *set, tb_page_addr_t addr)
{
    tb_page_addr_t index = addr >> TARGET_PAGE_BITS;
    struct page_entry *pe;
    PageDesc *pd;

    pe = g_tree_lookup(set->tree, &index);
    if (pe) {
        return false;
    }

    pd = page_find(uc, index);
    if (pd == NULL) {
        return false;
    }

    pe = page_entry_new(pd, index);
    g_tree_insert(set->tree, &pe->index, pe);

    /*
     * If this is either (1) the first insertion or (2) a page whose index
     * is higher than any other so far, just lock the page and move on.
     */
    if (set->max == NULL || pe->index > set->max->index) {
        set->max = pe;
#if 0
        do_page_entry_lock(pe);
#endif
        return false;
    }
    /*
     * Try to acquire out-of-order lock; if busy, return busy so that we acquire
     * locks in order.
     */
#if 0
    return page_entry_trylock(pe);
#else
    return 0;
#endif
}